

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O2

void crossRatio(structure_light *light,
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *crossPoint)

{
  long lVar1;
  double dVar2;
  ostream *poVar3;
  _OutputArray *p_Var4;
  int m;
  ulong uVar5;
  size_type __n;
  long lVar6;
  double dVar7;
  reference rVar8;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tempPoint;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tempCornerLinePoint;
  undefined1 local_228 [16];
  undefined8 local_218;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> tempCrossPoint;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tempWorldPoint;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> tempCornerPoint;
  Mat RMat1;
  double *local_1a0;
  long *local_168;
  Mat T1;
  double *local_140;
  long *local_108;
  Mat Rvec;
  Mat RMat2;
  
  for (__n = 0; (long)__n < (long)imageCount; __n = __n + 1) {
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&light->isRecognize,__n);
    if ((*rVar8._M_p & rVar8._M_mask) != 0) {
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                (&tempCrossPoint,
                 (crossPoint->
                 super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + __n);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                (&tempCornerPoint,
                 (light->calibImagePoint).
                 super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + __n);
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
                (&tempWorldPoint,
                 (light->calibBoardPoint).
                 super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + __n);
      tempCornerLinePoint.
      super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tempCornerLinePoint.
      super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tempCornerLinePoint.
      super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar5 = 0;
      while( true ) {
        if ((ulong)((long)tempCrossPoint.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)tempCrossPoint.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) break;
        _Rvec = (float)(int)uVar5 * patternLength.width;
        poVar3 = std::operator<<((ostream *)&std::cout,"ccs Point:");
        cv::operator<<(poVar3,(Point3_<float> *)&Rvec);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                  (&tempCornerLinePoint,(Point3_<float> *)&Rvec);
        uVar5 = uVar5 + 1;
      }
      cv::Mat::Mat(&Rvec,(light->R).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start + __n * 0x60);
      cv::Mat::Mat(&T1,(light->T).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start + __n * 0x60);
      cv::Mat::Mat(&RMat1);
      cv::Mat::Mat(&RMat2);
      tempPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_218 = 0;
      tempPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_start =
           (pointer)CONCAT44(tempPoint.
                             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
      local_228._0_4_ = 9.477423e-38;
      tempPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (Point3_<float> *)&Rvec;
      local_228._8_8_ = &RMat1;
      p_Var4 = (_OutputArray *)cv::noArray();
      cv::Rodrigues((_InputArray *)&tempPoint,(_OutputArray *)local_228,p_Var4);
      tempPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tempPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      tempPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar6 = 4;
      uVar5 = 0;
      while( true ) {
        if ((ulong)(((long)tempCornerLinePoint.
                           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)tempCornerLinePoint.
                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar5) break;
        dVar7 = (double)*(float *)((long)&(tempCornerLinePoint.
                                           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->x + lVar6);
        lVar1 = *local_168;
        dVar2 = (double)*(float *)((long)tempCornerLinePoint.
                                         super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar6 + -4);
        local_228._4_4_ =
             (float)(*(double *)((long)local_1a0 + lVar1) * dVar2 +
                     dVar7 * *(double *)((long)local_1a0 + lVar1 + 8) +
                    *(double *)((long)local_140 + *local_108));
        local_228._0_4_ =
             (float)((double)*(float *)((long)tempCornerLinePoint.
                                              super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar6 + -4
                                       ) * *local_1a0 + local_1a0[1] * dVar7 + *local_140);
        local_228._8_4_ =
             (float)(dVar2 * *(double *)((long)local_1a0 + lVar1 * 2) +
                     (double)*(float *)((long)&(tempCornerLinePoint.
                                                super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->x +
                                       lVar6) * *(double *)((long)local_1a0 + lVar1 * 2 + 8) +
                    *(double *)((long)local_140 + *local_108 * 2));
        poVar3 = std::operator<<((ostream *)&std::cout,"wcs Point:");
        cv::operator<<(poVar3,(Point3_<float> *)local_228);
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                  (&light->lightPlanePoint,(Point3_<float> *)local_228);
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0xc;
      }
      if (tempCornerLinePoint.
          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          tempCornerLinePoint.
          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        tempCornerLinePoint.
        super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             tempCornerLinePoint.
             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (tempWorldPoint.
          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          tempWorldPoint.
          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        tempWorldPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             tempWorldPoint.
             super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (tempCornerPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          tempCornerPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        tempCornerPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             tempCornerPoint.
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (tempCrossPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          tempCrossPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        tempCrossPoint.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             tempCrossPoint.
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~_Vector_base
                (&tempPoint.
                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>);
      cv::Mat::~Mat(&RMat2);
      cv::Mat::~Mat(&RMat1);
      cv::Mat::~Mat(&T1);
      cv::Mat::~Mat(&Rvec);
      std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~_Vector_base
                (&tempCornerLinePoint.
                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>);
      std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~_Vector_base
                (&tempWorldPoint.
                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>);
      std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                (&tempCornerPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
      std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                (&tempCrossPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    }
  }
  return;
}

Assistant:

void crossRatio(structure_light &light, vector<vector<Point2f>> &crossPoint)
{
    for (int i = 0; i < imageCount; i++)
    {
        if (light.isRecognize[i] == false)
            continue;
        vector<Point2f> tempCrossPoint = crossPoint[i];//某一张图中的光条上的7个点的二维坐标
        vector<Point2f> tempCornerPoint = light.calibImagePoint[i];//第i个靶标平面上圆形标记中心的点（49个）的二维坐标
        vector<Point3f> tempWorldPoint = light.calibBoardPoint[i];//第i个靶标平面上圆形标记中心的点（49个）的三维点坐标
        vector<Point3f> tempCornerLinePoint;//用于存光条上的点的三维坐标
        //计算第i个靶标上的7个光条上的点的三维坐标（靶标坐标系下）循环7次
        for (int m = 0; m < tempCrossPoint.size(); m++)//循环7次
        {
            //读取每条圆斑点形成直线上前三个特征点的坐标
            Point2f a, b, c;
            Point3f A, B, C;
            a = tempCornerPoint[m];
            b = tempCornerPoint[patternSize.width+m];
            c = tempCornerPoint[2 * patternSize.width+m];
            A = tempWorldPoint[m];
            B = tempWorldPoint[patternSize.width + m];
            C = tempWorldPoint[2 * patternSize.width + m];

            //计算交比
            double crossRatio = ((a.y - c.y) / (b.y - c.y)) / ((a.y - tempCrossPoint[m].y) / (b.y - tempCrossPoint[m].y));
            //double crossRatio = ((a.x - c.x) / (b.x - c.x)) / ((a.x - tempCrossPoint[m].x) / (b.x - tempCrossPoint[m].x));
            //已知4个点的图像坐标与3个点世界坐标，可以计算其中1点的世界坐标（现在已知三个圆形标记中心和一个光条上的点的图像坐标，和三个标记点的三维坐标）
            Point3f crPoint;
			crPoint.x = m * patternLength.width;
			crPoint.y = (crossRatio*(B.y - C.y)*A.y - B.y*(A.y - C.y)) / (crossRatio*(B.y - C.y) - (A.y - C.y));//解出Y坐标
            crPoint.z = 0;
            cout << "ccs Point:" << crPoint << endl;
            tempCornerLinePoint.push_back(crPoint);
        }

        Mat Rvec = light.R[i]; Mat T1 = light.T[i];//靶标坐标系和摄像机坐标系之间的旋转平移矩阵
        Mat RMat1,RMat2;
        Rodrigues(Rvec, RMat1);//1x3 -> 3x3 旋转向量（1x3）与旋转矩阵（3x3），二者可以通过罗德里格斯相互转化

        //将靶标坐标系下的三维坐标转换成摄像机坐标系下的三维坐标
        vector<Point3f> tempPoint;
        for (int n = 0; n < tempCornerLinePoint.size(); n++)
        {
            Point3f realPoint;//摄像机坐标系下的坐标，接下来利用旋转变换矩阵将坐标转化
            realPoint.x = RMat1.at<double>(0, 0)*tempCornerLinePoint[n].x + RMat1.at<double>(0, 1)*tempCornerLinePoint[n].y + T1.at<double>(0, 0);
            realPoint.y = RMat1.at<double>(1, 0)*tempCornerLinePoint[n].x + RMat1.at<double>(1, 1)*tempCornerLinePoint[n].y + T1.at<double>(1, 0);
            realPoint.z = RMat1.at<double>(2, 0)*tempCornerLinePoint[n].x + RMat1.at<double>(2, 1)*tempCornerLinePoint[n].y + T1.at<double>(2, 0);
            cout << "wcs Point:" << realPoint << endl << endl;
            light.lightPlanePoint.push_back(realPoint);
        }
        tempCornerLinePoint.clear();
        tempWorldPoint.clear();
        tempCornerPoint.clear();
        tempCrossPoint.clear();
    }
}